

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZThreadPool.cpp
# Opt level: O1

void __thiscall TPZThreadPool::run(TPZThreadPool *this,TPZAutoPointer<TPZReschedulableTask> *task)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  TPZAutoPointer<TPZTask> tpztask;
  unique_lock<std::mutex> lock;
  packaged_task<void_()> local_48;
  TPZAutoPointer<TPZReschedulableTask> local_30;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = (mutex_type *)(*(long *)task->fRef + 0x28);
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if (*(int *)(*(long *)task->fRef + 0x10) == 0) {
    std::packaged_task<void_()>::get_future(&local_48);
    _Var3._M_pi = local_48._M_state.
                  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    peVar2 = local_48._M_state.
             super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_48._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_48._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar1 = *(long *)task->fRef;
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x58);
    *(element_type **)(lVar1 + 0x50) = peVar2;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x58) = _Var3._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (local_48._M_state.
        super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48._M_state.
                 super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (this->mZombieThreads + this->mThreadsToDelete ==
        (int)((ulong)((long)(this->mThreads).
                            super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->mThreads).
                           super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3)) {
      (**(code **)(**(long **)task->fRef + 0x20))();
      std::condition_variable::notify_all();
    }
    else {
      local_30 = (TPZAutoPointer<TPZReschedulableTask>)task->fRef;
      LOCK();
      *(int *)(local_30.fRef + 8) = *(int *)(local_30.fRef + 8) + 1;
      UNLOCK();
      TPZAutoPointerDynamicCast<TPZTask,TPZReschedulableTask>
                ((TPZAutoPointer<TPZReschedulableTask> *)&local_48);
      TPZAutoPointer<TPZReschedulableTask>::~TPZAutoPointer(&local_30);
      appendTaskToQueue(this,(TPZAutoPointer<TPZTask> *)&local_48);
      *(undefined4 *)(*(long *)task->fRef + 0x10) = 1;
      TPZAutoPointer<TPZTask>::~TPZAutoPointer((TPZAutoPointer<TPZTask> *)&local_48);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void TPZThreadPool::run(TPZAutoPointer<TPZReschedulableTask> &task) {
    std::unique_lock<std::mutex> lock(task->mStateMutex);
    switch (task->mState) {
        case TPZReschedulableTask::EProcessingState::CREATED:
        {
            task->mFuture = task->mTask->get_future().share();
            if (threadCount() != 0) {
                TPZAutoPointer<TPZTask> tpztask = TPZAutoPointerDynamicCast<TPZTask>(task);
                appendTaskToQueue(tpztask);
                task->mState = TPZReschedulableTask::EProcessingState::SCHEDULED;
            } else {
                task->startInternal();
                task->mCondition.notify_all();
            }
            break;
        }
        case TPZReschedulableTask::EProcessingState::SCHEDULED:
        case TPZReschedulableTask::EProcessingState::STARTED:
        case TPZReschedulableTask::EProcessingState::FINISHED:
            break;
    }
}